

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O2

int Abc_NtkPrecomputePrint(Mio_Cell2_t *pCells,int nCells,Vec_Int_t *vInfo)

{
  Mio_Cell2_t *pMVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint i;
  long lVar5;
  uint nVarsInit;
  int iVar6;
  uint uVar7;
  int local_60;
  
  local_60 = 0;
  i = 0;
  for (lVar5 = 2; lVar5 < nCells; lVar5 = lVar5 + 1) {
    pMVar1 = pCells + lVar5;
    nVarsInit = *(uint *)&pMVar1->field_0x10 >> 0x1c;
    printf("%3d : %8s   Fanins = %d   ",lVar5,pMVar1->pName,(ulong)nVarsInit);
    Dau_DsdPrintFromTruth(&pMVar1->uTruth,nVarsInit);
    for (uVar7 = 0; uVar7 != nVarsInit + 1; uVar7 = uVar7 + 1) {
      iVar2 = Vec_IntEntry(vInfo,i);
      iVar3 = Vec_IntEntry(vInfo,i + 1);
      iVar4 = Vec_IntEntry(vInfo,i + 2);
      if (iVar2 != -1) {
        printf("%d : {",(ulong)uVar7);
        for (iVar6 = 0; nVarsInit << 2 != iVar6; iVar6 = iVar6 + 4) {
          printf(" %d ",(ulong)(iVar3 >> ((byte)iVar6 & 0x1f) & 0xf));
        }
        printf("}  Index = %d  ",(ulong)i);
        printf("Gain = %6.2f  ",(double)((float)iVar4 / 1000.0));
        Dau_DsdPrintFromTruth(&pCells[iVar2].uTruth,*(uint *)&pCells[iVar2].field_0x10 >> 0x1c);
        local_60 = local_60 + 1;
      }
      i = i + 3;
    }
  }
  return local_60;
}

Assistant:

int Abc_NtkPrecomputePrint( Mio_Cell2_t * pCells, int nCells, Vec_Int_t * vInfo )
{
    int i, n, v, Index = 0, nRecUsed = 0;
    for ( i = 2; i < nCells; i++ )
    {
        int nFanins = pCells[i].nFanins;
        printf( "%3d : %8s   Fanins = %d   ", i, pCells[i].pName, nFanins );
        Dau_DsdPrintFromTruth( &pCells[i].uTruth, nFanins );
        for ( n = 0; n <= nFanins; n++, Index += 3 )
        {
            int iCellA = Vec_IntEntry( vInfo, Index+0 );
            int iPerm  = Vec_IntEntry( vInfo, Index+1 );
            int Diff   = Vec_IntEntry( vInfo, Index+2 );
            if ( iCellA == -1 )
                continue;
            printf( "%d : {", n );
            for ( v = 0; v < nFanins; v++ )
                printf( " %d ", (iPerm >> (v << 2)) & 15 );
            printf( "}  Index = %d  ", Index );

            printf( "Gain = %6.2f  ", Scl_Int2Flt(Diff) );
            Dau_DsdPrintFromTruth( &pCells[iCellA].uTruth, pCells[iCellA].nFanins );
            nRecUsed++;
        }
    }
    return nRecUsed;
}